

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

size_t ZSTD_loadDictionaryContent
                 (ZSTD_matchState_t *ms,ldmState_t *ls,ZSTD_cwksp *ws,ZSTD_CCtx_params *params,
                 void *src,size_t srcSize,ZSTD_dictTableLoadMethod_e dtlm)

{
  undefined4 uVar1;
  int iVar2;
  ZSTD_compressionParameters cParams1;
  ZSTD_compressionParameters cParams2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  BYTE *iend_00;
  undefined4 in_stack_ffffffffffffff44;
  undefined4 in_stack_ffffffffffffff64;
  ZSTD_strategy in_stack_ffffffffffffff68;
  U32 local_8c;
  U32 local_88;
  bool local_81;
  size_t tagTableSize;
  U32 maxDictSize;
  int loadLdmDict;
  BYTE *iend;
  BYTE *ip;
  size_t srcSize_local;
  void *src_local;
  ZSTD_CCtx_params *params_local;
  ZSTD_cwksp *ws_local;
  ldmState_t *ls_local;
  ZSTD_matchState_t *ms_local;
  
  iend_00 = (BYTE *)((long)src + srcSize);
  local_81 = (params->ldmParams).enableLdm != 0 && ls != (ldmState_t *)0x0;
  uVar3 = (params->cParams).hashLog;
  uVar4 = (params->cParams).searchLog;
  uVar5 = (params->cParams).minMatch;
  uVar6 = (params->cParams).targetLength;
  uVar7 = (params->cParams).strategy;
  cParams1.minMatch = uVar7;
  cParams1.searchLog = uVar6;
  cParams1.hashLog = uVar5;
  cParams1.chainLog = uVar4;
  cParams1.windowLog = uVar3;
  uVar1 = (ms->cParams).windowLog;
  uVar8 = (ms->cParams).hashLog;
  uVar9 = (ms->cParams).searchLog;
  uVar10 = (ms->cParams).minMatch;
  uVar11 = (ms->cParams).targetLength;
  uVar12 = (ms->cParams).strategy;
  cParams2.minMatch = uVar12;
  cParams2.searchLog = uVar11;
  cParams2.hashLog = uVar10;
  cParams2.chainLog = uVar9;
  cParams2.windowLog = uVar8;
  cParams1.targetLength = in_stack_ffffffffffffff44;
  cParams1.strategy = uVar1;
  cParams2.targetLength = in_stack_ffffffffffffff64;
  cParams2.strategy = in_stack_ffffffffffffff68;
  ZSTD_assertEqualCParams(cParams1,cParams2);
  ip = (BYTE *)srcSize;
  srcSize_local = (size_t)src;
  if ((0x1fffffff < srcSize) && (0xdfffffff < srcSize)) {
    srcSize_local = (size_t)(iend_00 + -0xdfffffff);
    ip = (BYTE *)0xdfffffff;
  }
  ZSTD_window_update(&ms->window,(void *)srcSize_local,(size_t)ip,0);
  iVar2 = (int)iend_00;
  if (params->forceWindow == 0) {
    local_88 = iVar2 - (int)(ms->window).base;
  }
  else {
    local_88 = 0;
  }
  ms->loadedDictEnd = local_88;
  ms->forceNonContiguous = params->deterministicRefPrefix;
  if (local_81) {
    ZSTD_window_update(&ls->window,(void *)srcSize_local,(size_t)ip,0);
    if (params->forceWindow == 0) {
      local_8c = iVar2 - (int)(ls->window).base;
    }
    else {
      local_8c = 0;
    }
    ls->loadedDictEnd = local_8c;
  }
  if ((BYTE *)0x8 < ip) {
    ZSTD_overflowCorrectIfNeeded(ms,ws,params,(void *)srcSize_local,iend_00);
    if (local_81) {
      ZSTD_ldm_fillHashTable(ls,(BYTE *)srcSize_local,iend_00,&params->ldmParams);
    }
    switch((params->cParams).strategy) {
    case ZSTD_fast:
      ZSTD_fillHashTable(ms,iend_00,dtlm);
      break;
    case ZSTD_dfast:
      ZSTD_fillDoubleHashTable(ms,iend_00,dtlm);
      break;
    case ZSTD_greedy:
    case ZSTD_lazy:
    case ZSTD_lazy2:
      if (ms->dedicatedDictSearch == 0) {
        if (params->useRowMatchFinder == ZSTD_urm_enableRowMatchFinder) {
          memset(ms->tagTable,0,(1L << ((byte)(params->cParams).hashLog & 0x3f)) << 1);
          ZSTD_row_update(ms,iend_00 + -8);
        }
        else {
          ZSTD_insertAndFindFirstIndex(ms,iend_00 + -8);
        }
      }
      else {
        ZSTD_dedicatedDictSearch_lazy_loadDictionary(ms,iend_00 + -8);
      }
      break;
    case ZSTD_btlazy2:
    case ZSTD_btopt:
    case ZSTD_btultra:
    case ZSTD_btultra2:
      ZSTD_updateTree(ms,iend_00 + -8,iend_00);
    }
    ms->nextToUpdate = iVar2 - (int)(ms->window).base;
  }
  return 0;
}

Assistant:

static size_t ZSTD_loadDictionaryContent(ZSTD_matchState_t* ms,
                                         ldmState_t* ls,
                                         ZSTD_cwksp* ws,
                                         ZSTD_CCtx_params const* params,
                                         const void* src, size_t srcSize,
                                         ZSTD_dictTableLoadMethod_e dtlm)
{
    const BYTE* ip = (const BYTE*) src;
    const BYTE* const iend = ip + srcSize;
    int const loadLdmDict = params->ldmParams.enableLdm && ls != NULL;

    /* Assert that we the ms params match the params we're being given */
    ZSTD_assertEqualCParams(params->cParams, ms->cParams);

    if (srcSize > ZSTD_CHUNKSIZE_MAX) {
        /* Allow the dictionary to set indices up to exactly ZSTD_CURRENT_MAX.
         * Dictionaries right at the edge will immediately trigger overflow
         * correction, but I don't want to insert extra constraints here.
         */
        U32 const maxDictSize = ZSTD_CURRENT_MAX - 1;
        /* We must have cleared our windows when our source is this large. */
        assert(ZSTD_window_isEmpty(ms->window));
        if (loadLdmDict)
            assert(ZSTD_window_isEmpty(ls->window));
        /* If the dictionary is too large, only load the suffix of the dictionary. */
        if (srcSize > maxDictSize) {
            ip = iend - maxDictSize;
            src = ip;
            srcSize = maxDictSize;
        }
    }

    DEBUGLOG(4, "ZSTD_loadDictionaryContent(): useRowMatchFinder=%d", (int)params->useRowMatchFinder);
    ZSTD_window_update(&ms->window, src, srcSize, /* forceNonContiguous */ 0);
    ms->loadedDictEnd = params->forceWindow ? 0 : (U32)(iend - ms->window.base);
    ms->forceNonContiguous = params->deterministicRefPrefix;

    if (loadLdmDict) {
        ZSTD_window_update(&ls->window, src, srcSize, /* forceNonContiguous */ 0);
        ls->loadedDictEnd = params->forceWindow ? 0 : (U32)(iend - ls->window.base);
    }

    if (srcSize <= HASH_READ_SIZE) return 0;

    ZSTD_overflowCorrectIfNeeded(ms, ws, params, ip, iend);

    if (loadLdmDict)
        ZSTD_ldm_fillHashTable(ls, ip, iend, &params->ldmParams);

    switch(params->cParams.strategy)
    {
    case ZSTD_fast:
        ZSTD_fillHashTable(ms, iend, dtlm);
        break;
    case ZSTD_dfast:
        ZSTD_fillDoubleHashTable(ms, iend, dtlm);
        break;

    case ZSTD_greedy:
    case ZSTD_lazy:
    case ZSTD_lazy2:
        assert(srcSize >= HASH_READ_SIZE);
        if (ms->dedicatedDictSearch) {
            assert(ms->chainTable != NULL);
            ZSTD_dedicatedDictSearch_lazy_loadDictionary(ms, iend-HASH_READ_SIZE);
        } else {
            assert(params->useRowMatchFinder != ZSTD_urm_auto);
            if (params->useRowMatchFinder == ZSTD_urm_enableRowMatchFinder) {
                size_t const tagTableSize = ((size_t)1 << params->cParams.hashLog) * sizeof(U16);
                ZSTD_memset(ms->tagTable, 0, tagTableSize);
                ZSTD_row_update(ms, iend-HASH_READ_SIZE);
                DEBUGLOG(4, "Using row-based hash table for lazy dict");
            } else {
                ZSTD_insertAndFindFirstIndex(ms, iend-HASH_READ_SIZE);
                DEBUGLOG(4, "Using chain-based hash table for lazy dict");
            }
        }
        break;

    case ZSTD_btlazy2:   /* we want the dictionary table fully sorted */
    case ZSTD_btopt:
    case ZSTD_btultra:
    case ZSTD_btultra2:
        assert(srcSize >= HASH_READ_SIZE);
        ZSTD_updateTree(ms, iend-HASH_READ_SIZE, iend);
        break;

    default:
        assert(0);  /* not possible : not a valid strategy id */
    }

    ms->nextToUpdate = (U32)(iend - ms->window.base);
    return 0;
}